

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib582.c
# Opt level: O1

void removeFd(Sockets *sockets,curl_socket_t fd,int mention)

{
  curl_socket_t *pcVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  
  if (mention != 0) {
    fprintf(_stderr,"Remove socket fd %d\n",fd);
  }
  uVar2 = (ulong)(uint)sockets->count;
  if (0 < sockets->count) {
    lVar4 = -1;
    lVar3 = 0;
    do {
      pcVar1 = sockets->sockets;
      if (pcVar1[lVar3] == fd) {
        if (lVar3 < (int)uVar2 + -1) {
          memmove(pcVar1 + lVar3,pcVar1 + lVar3 + 1,((int)uVar2 + lVar4) * 4);
        }
        sockets->count = sockets->count + -1;
      }
      lVar3 = lVar3 + 1;
      uVar2 = (ulong)sockets->count;
      lVar4 = lVar4 + -1;
    } while (lVar3 < (long)uVar2);
  }
  return;
}

Assistant:

static void removeFd(struct Sockets* sockets, curl_socket_t fd, int mention)
{
  int i;

  if(mention)
    fprintf(stderr, "Remove socket fd %d\n", (int) fd);

  for (i = 0; i < sockets->count; ++i) {
    if (sockets->sockets[i] == fd) {
      if (i < sockets->count - 1)
        memmove(&sockets->sockets[i], &sockets->sockets[i + 1],
              sizeof(curl_socket_t) * (sockets->count - (i + 1)));
      --sockets->count;
    }
  }
}